

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_LogInt(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  DObject *this;
  bool bVar1;
  char *pcVar2;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      this = (DObject *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (this != (DObject *)0x0) {
          bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
          if (!bVar1) {
            pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_003e3776;
          }
        }
LAB_003e3741:
        if (numparam == 1) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[1].field_0.field_3.Type == '\0') {
            Printf("%d\n",(ulong)(uint)param[1].field_0.i);
            return 0;
          }
          pcVar2 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc95,
                      "int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      if (this == (DObject *)0x0) goto LAB_003e3741;
    }
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e3776:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc94,"int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LogInt)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(num);
	Printf("%d\n", num);
	return 0;
}